

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O1

int libtorrent::unchoke_sort
              (vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               *peers,int max_upload_rate,time_duration unchoke_interval,session_settings *sett)

{
  mutex *pmVar1;
  _Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_int> _Var2;
  pointer pppVar3;
  peer_connection *this;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  pointer pppVar9;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  _Var10;
  uint uVar11;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  __nth;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  _Var12;
  int iVar13;
  pointer pppVar14;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *__range2;
  unique_lock<std::mutex> l;
  undefined1 local_68 [16];
  session_settings *local_58;
  mutex *local_50;
  rep local_48;
  _Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
  local_40;
  
  pmVar1 = &sett->m_mutex;
  local_68._8_4_ = local_68._8_4_ & 0xffffff00;
  local_68._0_8_ = pmVar1;
  local_48 = unchoke_interval.__r;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  iVar5 = (sett->m_store).m_ints._M_elems[0x1f];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  if (iVar5 == 3) {
    pppVar3 = (peers->
              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar14 = (peers->
                    super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; pppVar14 != pppVar3;
        pppVar14 = pppVar14 + 1) {
      this = *pppVar14;
      iVar5 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(this);
      if (((char)iVar5 == '\0') &&
         (((this->super_peer_connection_hot_members).field_0x28 & 0x10) != 0)) {
        if ((this->field_0x762 & 0x40) == 0) {
          peer_connection::decrease_est_reciprocation_rate(this);
        }
        else {
          peer_connection::increase_est_reciprocation_rate(this);
        }
      }
    }
    _Var12._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (_Var12._M_current != _Var10._M_current) {
      uVar7 = (long)_Var10._M_current - (long)_Var12._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_68._0_8_ = anon_unknown_10::bittyrant_unchoke_compare;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var12,_Var10,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
                  *)local_68);
      local_40._M_comp._M_f = anon_unknown_10::bittyrant_unchoke_compare;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var12,_Var10,&local_40);
    }
    pppVar14 = (peers->
               super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    pppVar3 = (peers->
              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pppVar14 != pppVar3) {
      iVar5 = 0;
      do {
        pppVar9 = pppVar14 + 1;
        iVar13 = (*pppVar14)->m_est_reciprocation_rate;
        iVar5 = (uint)(iVar13 <= max_upload_rate) + iVar5;
        if (max_upload_rate < iVar13) {
          return iVar5;
        }
        max_upload_rate = max_upload_rate - iVar13;
        pppVar14 = pppVar9;
      } while (pppVar9 != pppVar3);
      return iVar5;
    }
    return 0;
  }
  local_68[8] = false;
  local_68._0_8_ = pmVar1;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  uVar8 = (sett->m_store).m_ints._M_elems[0x53];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  uVar11 = 0x7fffffff;
  if (uVar8 < 0x7fffffff) {
    uVar11 = uVar8;
  }
  local_68[8] = false;
  local_68._0_8_ = pmVar1;
  local_50 = pmVar1;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = 1;
  iVar5 = (sett->m_store).m_ints._M_elems[0x1f];
  local_58 = sett;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  if (iVar5 == 2) {
    _Var12._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (_Var12._M_current != _Var10._M_current) {
      uVar7 = (long)_Var10._M_current - (long)_Var12._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_68._0_8_ = anon_unknown_10::upload_rate_compare;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var12,_Var10,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
                  *)local_68);
      local_40._M_comp._M_f = anon_unknown_10::upload_rate_compare;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var12,_Var10,&local_40);
    }
    pppVar14 = (peers->
               super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    pppVar3 = (peers->
              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pppVar14 == pppVar3) {
      uVar11 = 1;
    }
    else {
      iVar5 = 0;
      iVar13 = 0x400;
      do {
        pppVar9 = pppVar14 + 1;
        iVar6 = (int)(((((*pppVar14)->m_statistics).m_stat[0].m_total_counter -
                       (*pppVar14)->m_uploaded_at_last_round) * 1000) / (local_48 / 1000000));
        iVar5 = (uint)(iVar13 <= iVar6) + iVar5;
        if (iVar6 < iVar13) break;
        iVar13 = iVar13 + 0x400;
        pppVar14 = pppVar9;
      } while (pppVar9 != pppVar3);
      uVar11 = iVar5 + 1;
    }
  }
  pmVar1 = local_50;
  uVar8 = (uint)((ulong)((long)(peers->
                               super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peers->
                              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar11 < (int)uVar8) {
    uVar8 = uVar11;
  }
  local_68._0_8_ = local_50;
  local_68._8_4_ = local_68._8_4_ & 0xffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  iVar5 = (local_58->m_store).m_ints._M_elems[0x20];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  if (iVar5 == 0) {
LAB_001944a6:
    local_68._0_8_ = pmVar1;
    local_68[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    _Var2.super__Tuple_impl<1UL,_std::_Placeholder<2>,_int>.super__Tuple_impl<2UL,_int>.
    super__Head_base<2UL,_int,_false>._M_head_impl =
         (_Tuple_impl<1UL,_std::_Placeholder<2>,_int>)(local_58->m_store).m_ints._M_elems[0x39];
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    _Var12._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if ((_Var12._M_current != _Var10._M_current) &&
       (_Var12._M_current + (int)uVar8 != _Var10._M_current)) {
      uVar7 = (long)_Var10._M_current - (long)_Var12._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_68._0_8_ = anon_unknown_10::unchoke_compare_rr;
      local_68._8_4_ =
           _Var2.super__Tuple_impl<1UL,_std::_Placeholder<2>,_int>.super__Tuple_impl<2UL,_int>.
           super__Head_base<2UL,_int,_false>._M_head_impl;
      std::
      __introselect<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*,int)>>>
                (_Var12,(__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                         )(_Var12._M_current + (int)uVar8),_Var10,
                 (ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*,_int)>_>
                  *)local_68);
    }
  }
  else {
    local_68._0_8_ = pmVar1;
    local_68[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    iVar5 = (local_58->m_store).m_ints._M_elems[0x20];
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    if (iVar5 == 1) {
      _Var12._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var10._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (_Var12._M_current == _Var10._M_current) {
        return uVar11;
      }
      __nth._M_current = _Var12._M_current + (int)uVar8;
      if (__nth._M_current == _Var10._M_current) {
        return uVar11;
      }
      uVar7 = (long)_Var10._M_current - (long)_Var12._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar8 = (uint)lVar4;
      local_68._0_8_ = anon_unknown_10::unchoke_compare_fastest_upload;
    }
    else {
      local_68._0_8_ = pmVar1;
      local_68[8] = false;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
      local_68[8] = true;
      iVar5 = (local_58->m_store).m_ints._M_elems[0x20];
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
      if (iVar5 != 2) goto LAB_001944a6;
      _Var12._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var10._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (_Var12._M_current == _Var10._M_current) {
        return uVar11;
      }
      __nth._M_current = _Var12._M_current + (int)uVar8;
      if (__nth._M_current == _Var10._M_current) {
        return uVar11;
      }
      uVar7 = (long)_Var10._M_current - (long)_Var12._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar8 = (uint)lVar4;
      local_68._0_8_ = anon_unknown_10::unchoke_compare_anti_leech;
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
              (_Var12,__nth,_Var10,(ulong)((uVar8 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
                *)local_68);
  }
  return uVar11;
}

Assistant:

int unchoke_sort(std::vector<peer_connection*>& peers
		, int const max_upload_rate
		, time_duration const unchoke_interval
		, aux::session_settings const& sett)
	{
#if TORRENT_USE_ASSERTS
		for (auto p : peers)
		{
			TORRENT_ASSERT(p->self());
			TORRENT_ASSERT(p->associated_torrent().lock());
		}
#endif

#if TORRENT_ABI_VERSION == 1
		// ==== BitTyrant ====
		//
		// if we're using the bittyrant unchoker, go through all peers that
		// we have unchoked already, and adjust our estimated reciprocation
		// rate. If the peer has reciprocated, lower the estimate, if it hasn't,
		// increase the estimate (this attempts to optimize "ROI" of upload
		// capacity, by sending just enough to be reciprocated).
		// For more information, see: http://bittyrant.cs.washington.edu/
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::bittyrant_choker)
		{
			for (auto const p : peers)
			{
				if (p->is_choked() || !p->is_interesting()) continue;

				if (!p->has_peer_choked())
				{
					// we're unchoked, we may want to lower our estimated
					// reciprocation rate
					p->decrease_est_reciprocation_rate();
				}
				else
				{
					// we've unchoked this peer, and it hasn't reciprocated
					// we may want to increase our estimated reciprocation rate
					p->increase_est_reciprocation_rate();
				}
			}

			// if we're using the bittyrant choker, sort peers by their return
			// on investment. i.e. download rate / upload rate
			// TODO: use an incremental partial_sort() here
			std::sort(peers.begin(), peers.end()
				, std::bind(&bittyrant_unchoke_compare, _1, _2));

			int upload_capacity_left = max_upload_rate;

			// now, figure out how many peers should be unchoked. We deduct the
			// estimated reciprocation rate from our upload_capacity estimate
			// until there none left
			int upload_slots = 0;

			for (auto const p : peers)
			{
				TORRENT_ASSERT(p != nullptr);

				if (p->est_reciprocation_rate() > upload_capacity_left) break;

				++upload_slots;
				upload_capacity_left -= p->est_reciprocation_rate();
			}

			return upload_slots;
		}
#else
		TORRENT_UNUSED(max_upload_rate);
#endif

		int upload_slots = sett.get_int(settings_pack::unchoke_slots_limit);
		if (upload_slots < 0)
			upload_slots = std::numeric_limits<int>::max();

		// ==== rate-based ====
		//
		// The rate based unchoker looks at our upload rate to peers, and find
		// a balance between number of upload slots and the rate we achieve. The
		// intention is to not spread upload bandwidth too thin, but also to not
		// unchoke few enough peers to not be able to saturate the up-link.
		// this is done by traversing the peers sorted by our upload rate to
		// them in decreasing rates. For each peer we increase our threshold
		// by 1 kB/s. The first peer we get to whom we upload slower than
		// the threshold, we stop and that's the number of unchoke slots we have.
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::rate_based_choker)
		{
			// first reset the number of unchoke slots, because we'll calculate
			// it purely based on the current state of our peers.
			upload_slots = 0;

			// TODO: use an incremental partial_sort() here. We don't need
			// to sort the entire list

			// TODO: make the comparison function a free function and move it
			// into this cpp file
			std::sort(peers.begin(), peers.end()
				, std::bind(&upload_rate_compare, _1, _2));

			// TODO: make configurable
			int rate_threshold = 1024;

			for (auto const p : peers)
			{
				int const rate = int(p->uploaded_in_last_round()
					* 1000 / total_milliseconds(unchoke_interval));

				if (rate < rate_threshold) break;

				++upload_slots;

				// TODO: make configurable
				rate_threshold += 1024;
			}
			++upload_slots;
		}

		// sorts the peers that are eligible for unchoke by download rate and
		// secondary by total upload. The reason for this is, if all torrents are
		// being seeded, the download rate will be 0, and the peers we have sent
		// the least to should be unchoked

		// we use partial sort here, because we only care about the top
		// upload_slots peers.

		int const slots = std::min(upload_slots, int(peers.size()));

		if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::round_robin)
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);

			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::fastest_upload)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_fastest_upload, _1, _2));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::anti_leech)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_anti_leech, _1, _2));
		}
		else
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));

			TORRENT_ASSERT_FAIL();
		}

		return upload_slots;
	}